

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Argument::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Argument *this,PatternList *left)

{
  element_type *peVar1;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ppVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  unsigned_long uVar5;
  pointer psVar6;
  long lVar7;
  undefined1 local_59;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *local_58;
  Argument *local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar6 = (left->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6;
  local_58 = __return_storage_ptr__;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 4;
    uVar5 = 0;
    local_50 = this;
    do {
      peVar1 = (psVar6->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar1 != (element_type *)0x0) &&
         (lVar4 = __dynamic_cast(peVar1,&Pattern::typeinfo,&typeinfo,0), ppVar2 = local_58,
         lVar4 != 0)) {
        local_58->first = uVar5;
        iVar3 = (*(local_50->super_LeafPattern).super_Pattern._vptr_Pattern[3])();
        local_48 = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Argument,std::allocator<docopt::Argument>,std::__cxx11::string_const&,docopt::value_const&>
                  (a_Stack_40,(Argument **)&local_48,(allocator<docopt::Argument> *)&local_59,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar3),(value *)(lVar4 + 0x28));
        (ppVar2->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = local_48;
        (ppVar2->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = a_Stack_40[0]._M_pi;
        return local_58;
      }
      uVar5 = uVar5 + 1;
      psVar6 = psVar6 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar5);
  }
  return local_58;
}

Assistant:

std::pair<size_t, std::shared_ptr<LeafPattern>> Argument::single_match(PatternList const& left) const
{
	std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};
	
	for(size_t i = 0, size = left.size(); i < size; ++i)
	{
		auto arg = dynamic_cast<Argument const*>(left[i].get());
		if (arg) {
			ret.first = i;
			ret.second = std::make_shared<Argument>(name(), arg->getValue());
			break;
		}
	}
	
	return ret;
}